

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O0

void avx::Subtract(uint32_t rowSizeIn1,uint32_t rowSizeIn2,uint32_t rowSizeOut,uint8_t *in1Y,
                  uint8_t *in2Y,uint8_t *outY,uint8_t *outYEnd,uint32_t simdWidth,
                  uint32_t totalSimdWidth,uint32_t nonSimdWidth)

{
  undefined1 auVar1 [32];
  uint8_t *puVar2;
  undefined1 (*in_RCX) [32];
  uint in_EDX;
  uint in_ESI;
  uint in_EDI;
  undefined1 (*in_R8) [32];
  uint8_t *in_R9;
  uint8_t *outXEnd;
  uint8_t *outX;
  simd *src1End;
  simd *dst;
  simd *src2;
  simd *src1;
  uint8_t *local_198;
  byte *local_190;
  byte *local_188;
  uint8_t *local_150;
  undefined1 (*local_148) [32];
  undefined1 (*local_140) [32];
  uint8_t *local_138;
  undefined1 (*local_130) [32];
  undefined1 (*local_128) [32];
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  
  local_130 = in_R8;
  local_128 = in_RCX;
  for (local_138 = in_R9; local_138 != outX; local_138 = local_138 + in_EDX) {
    local_148 = local_130;
    local_150 = local_138;
    for (local_140 = local_128; local_140 != local_128 + ((ulong)outYEnd & 0xffffffff);
        local_140 = local_140 + 1) {
      auVar1 = vpminub_avx2(*local_140,*local_148);
      auVar1 = vpsubb_avx2(*local_140,auVar1);
      local_100 = auVar1._0_8_;
      uStack_f8 = auVar1._8_8_;
      uStack_f0 = auVar1._16_8_;
      uStack_e8 = auVar1._24_8_;
      *(undefined8 *)local_150 = local_100;
      *(undefined8 *)(local_150 + 8) = uStack_f8;
      *(undefined8 *)(local_150 + 0x10) = uStack_f0;
      *(undefined8 *)(local_150 + 0x18) = uStack_e8;
      local_148 = local_148 + 1;
      local_150 = local_150 + 0x20;
    }
    if (totalSimdWidth != 0) {
      local_188 = *local_128 + simdWidth;
      local_190 = *local_130 + simdWidth;
      local_198 = local_138 + simdWidth;
      puVar2 = local_198 + totalSimdWidth;
      for (; local_198 != puVar2; local_198 = local_198 + 1) {
        if (*local_188 < *local_190) {
          *local_198 = '\0';
        }
        else {
          *local_198 = *local_188 - *local_190;
        }
        local_188 = local_188 + 1;
        local_190 = local_190 + 1;
      }
    }
    local_128 = (undefined1 (*) [32])(*local_128 + in_EDI);
    local_130 = (undefined1 (*) [32])(*local_130 + in_ESI);
  }
  return;
}

Assistant:

void Subtract( uint32_t rowSizeIn1, uint32_t rowSizeIn2, uint32_t rowSizeOut, const uint8_t * in1Y, const uint8_t * in2Y,
                   uint8_t * outY, const uint8_t * outYEnd, uint32_t simdWidth, uint32_t totalSimdWidth, uint32_t nonSimdWidth )
    {
        for( ; outY != outYEnd; outY += rowSizeOut, in1Y += rowSizeIn1, in2Y += rowSizeIn2 ) {
            const simd * src1 = reinterpret_cast <const simd*> (in1Y);
            const simd * src2 = reinterpret_cast <const simd*> (in2Y);
            simd       * dst  = reinterpret_cast <simd*> (outY);

            const simd * src1End = src1 + simdWidth;

            for( ; src1 != src1End; ++src1, ++src2, ++dst ) {
                simd data = _mm256_loadu_si256( src1 );
                _mm256_storeu_si256( dst, _mm256_sub_epi8( data, _mm256_min_epu8( data, _mm256_loadu_si256( src2 ) ) ) );
            }

            if( nonSimdWidth > 0 ) {
                const uint8_t * in1X = in1Y + totalSimdWidth;
                const uint8_t * in2X = in2Y + totalSimdWidth;
                uint8_t       * outX = outY + totalSimdWidth;

                const uint8_t * outXEnd = outX + nonSimdWidth;

                for( ; outX != outXEnd; ++outX, ++in1X, ++in2X ) {
                    if( (*in2X) > (*in1X) )
                        (*outX) = 0;
                    else
                        (*outX) = (*in1X) - (*in2X);
                }
            }
        }
    }